

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MLMatcher.cpp
# Opt level: O0

bool anon_unknown.dwarf_105e02f::createLiteralBindings
               (Literal *baseLit,LiteralList *alts,Clause *instCl,Literal *resolvedLit,
               uint **boundVarData,TermList ***altBindingPtrs,TermList **altBindingData)

{
  TermList *pTVar1;
  bool bVar2;
  bool bVar3;
  undefined1 uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint *puVar8;
  Literal *lit;
  Literal *in_RCX;
  List<Kernel::Literal_*> *in_RSI;
  Term *in_RDI;
  long *in_R8;
  long *in_R9;
  long *in_stack_00000008;
  ArrayStoringBinder binder_4;
  ArrayStoringBinder binder_3;
  ArrayStoringBinder binder_2;
  ArrayStoringBinder binder_1;
  ArrayStoringBinder binder;
  Literal *alit;
  Iterator ait;
  uint numVars;
  uint var_1;
  uint nextPos;
  uint var;
  VariableIterator bvit;
  undefined4 in_stack_fffffffffffffe78;
  uint in_stack_fffffffffffffe7c;
  undefined1 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe81;
  undefined1 in_stack_fffffffffffffe82;
  undefined1 in_stack_fffffffffffffe83;
  uint in_stack_fffffffffffffe84;
  uint in_stack_fffffffffffffe88;
  uint in_stack_fffffffffffffe8c;
  Term *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  uint in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  Literal *in_stack_fffffffffffffeb0;
  uint in_stack_fffffffffffffeb8;
  undefined2 in_stack_fffffffffffffebc;
  undefined1 in_stack_fffffffffffffebe;
  undefined1 in_stack_fffffffffffffebf;
  undefined6 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  Term *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  ArrayStoringBinder local_108;
  ArrayStoringBinder *in_stack_ffffffffffffff08;
  Term *in_stack_ffffffffffffff10;
  Term *in_stack_ffffffffffffff18;
  ArrayStoringBinder local_d8;
  ArrayStoringBinder local_c8;
  Literal *local_b8;
  Iterator local_b0;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  TermList local_98;
  uint local_8c;
  long *local_30;
  long *local_28;
  Literal *local_20;
  List<Kernel::Literal_*> *local_10;
  Term *local_8;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (((anonymous_namespace)::
       createLiteralBindings(Kernel::Literal*,Lib::List<Kernel::Literal*>const*,Kernel::Clause*,Kernel::Literal*,unsigned_int*&,Kernel::TermList*&*,Kernel::TermList*&)
       ::variablePositions == '\0') &&
     (iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   createLiteralBindings(Kernel::Literal*,Lib::List<Kernel::Literal*>const*,Kernel::Clause*,Kernel::Literal*,unsigned_int*&,Kernel::TermList*&*,Kernel::TermList*&)
                                   ::variablePositions), iVar5 != 0)) {
    Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::DHMap
              (&createLiteralBindings::variablePositions);
    __cxa_atexit(Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::~DHMap
                 ,&createLiteralBindings::variablePositions,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         createLiteralBindings(Kernel::Literal*,Lib::List<Kernel::Literal*>const*,Kernel::Clause*,Kernel::Literal*,unsigned_int*&,Kernel::TermList*&*,Kernel::TermList*&)
                         ::variablePositions);
  }
  if (((anonymous_namespace)::
       createLiteralBindings(Kernel::Literal*,Lib::List<Kernel::Literal*>const*,Kernel::Clause*,Kernel::Literal*,unsigned_int*&,Kernel::TermList*&*,Kernel::TermList*&)
       ::varNums == '\0') &&
     (iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   createLiteralBindings(Kernel::Literal*,Lib::List<Kernel::Literal*>const*,Kernel::Clause*,Kernel::Literal*,unsigned_int*&,Kernel::TermList*&*,Kernel::TermList*&)
                                   ::varNums), iVar5 != 0)) {
    Lib::BinaryHeap<unsigned_int,_Lib::Int>::BinaryHeap(&createLiteralBindings::varNums);
    __cxa_atexit(Lib::BinaryHeap<unsigned_int,_Lib::Int>::~BinaryHeap,
                 &createLiteralBindings::varNums,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         createLiteralBindings(Kernel::Literal*,Lib::List<Kernel::Literal*>const*,Kernel::Clause*,Kernel::Literal*,unsigned_int*&,Kernel::TermList*&*,Kernel::TermList*&)
                         ::varNums);
  }
  Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::reset
            (&createLiteralBindings::variablePositions);
  Lib::BinaryHeap<unsigned_int,_Lib::Int>::reset(&createLiteralBindings::varNums);
  Kernel::VariableIterator::VariableIterator
            ((VariableIterator *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
             in_stack_fffffffffffffee8);
  while (bVar2 = Kernel::VariableIterator::hasNext
                           ((VariableIterator *)
                            CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)), bVar2) {
    local_98 = Kernel::VariableIterator::next
                         ((VariableIterator *)
                          CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    local_8c = Kernel::TermList::var(&local_98);
    Lib::BinaryHeap<unsigned_int,_Lib::Int>::insert
              ((BinaryHeap<unsigned_int,_Lib::Int> *)
               CONCAT44(in_stack_fffffffffffffe84,
                        CONCAT13(in_stack_fffffffffffffe83,
                                 CONCAT12(in_stack_fffffffffffffe82,
                                          CONCAT11(in_stack_fffffffffffffe81,
                                                   in_stack_fffffffffffffe80)))),
               in_stack_fffffffffffffe7c);
  }
  local_9c = 0;
  while (bVar2 = Lib::BinaryHeap<unsigned_int,_Lib::Int>::isEmpty(&createLiteralBindings::varNums),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    local_a0 = Lib::BinaryHeap<unsigned_int,_Lib::Int>::pop
                         ((BinaryHeap<unsigned_int,_Lib::Int> *)
                          CONCAT44(in_stack_fffffffffffffe84,
                                   CONCAT13(in_stack_fffffffffffffe83,
                                            CONCAT12(in_stack_fffffffffffffe82,
                                                     CONCAT11(in_stack_fffffffffffffe81,
                                                              in_stack_fffffffffffffe80)))));
    while( true ) {
      bVar3 = Lib::BinaryHeap<unsigned_int,_Lib::Int>::isEmpty(&createLiteralBindings::varNums);
      bVar2 = false;
      if (!bVar3) {
        puVar8 = Lib::BinaryHeap<unsigned_int,_Lib::Int>::top(&createLiteralBindings::varNums);
        bVar2 = *puVar8 == local_a0;
      }
      if (!bVar2) break;
      Lib::BinaryHeap<unsigned_int,_Lib::Int>::pop
                ((BinaryHeap<unsigned_int,_Lib::Int> *)
                 CONCAT44(in_stack_fffffffffffffe84,
                          CONCAT13(in_stack_fffffffffffffe83,
                                   CONCAT12(in_stack_fffffffffffffe82,
                                            CONCAT11(in_stack_fffffffffffffe81,
                                                     in_stack_fffffffffffffe80)))));
    }
    in_stack_fffffffffffffecf =
         Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::insert
                   ((DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash> *)
                    in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88);
    puVar8 = (uint *)*local_28;
    *local_28 = (long)(puVar8 + 1);
    *puVar8 = local_a0;
    local_9c = local_9c + 1;
  }
  local_a4 = local_9c;
  Lib::List<Kernel::Literal_*>::Iterator::Iterator(&local_b0,local_10);
  while (uVar4 = Lib::List<Kernel::Literal_*>::Iterator::hasNext((Iterator *)0x8a209e), (bool)uVar4)
  {
    lit = Lib::List<Kernel::Literal_*>::Iterator::next
                    ((Iterator *)
                     CONCAT44(in_stack_fffffffffffffe84,
                              CONCAT13(in_stack_fffffffffffffe83,
                                       CONCAT12(in_stack_fffffffffffffe82,
                                                CONCAT11(in_stack_fffffffffffffe81,
                                                         in_stack_fffffffffffffe80)))));
    local_b8 = lit;
    if (lit != local_20) {
      in_stack_fffffffffffffebf = Kernel::Literal::isEquality((Literal *)0x8a20f3);
      if ((bool)in_stack_fffffffffffffebf) {
        in_stack_fffffffffffffebe =
             Kernel::MatchingUtils::matchArgs
                       (in_stack_fffffffffffffe90,
                        (Term *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        if ((bool)in_stack_fffffffffffffebe) {
          ArrayStoringBinder::ArrayStoringBinder
                    (&local_c8,(TermList *)*in_stack_00000008,
                     &createLiteralBindings::variablePositions);
          Kernel::MatchingUtils::matchArgs<(anonymous_namespace)::ArrayStoringBinder>
                    (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
          *(long *)*local_30 = *in_stack_00000008;
          *local_30 = *local_30 + 8;
          *in_stack_00000008 = *in_stack_00000008 + (ulong)local_a4 * 8;
          if (local_20 == (Literal *)0x0) {
            in_stack_fffffffffffffeb0 = (Literal *)*in_stack_00000008;
            *in_stack_00000008 = (long)&(in_stack_fffffffffffffeb0->super_Term)._functor;
            in_stack_fffffffffffffeb8 =
                 Kernel::Clause::getLiteralPosition
                           ((Clause *)
                            CONCAT17(in_stack_fffffffffffffecf,
                                     CONCAT16(uVar4,in_stack_fffffffffffffec8)),lit);
            Kernel::TermList::setContent
                      ((TermList *)in_stack_fffffffffffffeb0,(ulong)in_stack_fffffffffffffeb8);
          }
          else {
            pTVar1 = (TermList *)*in_stack_00000008;
            *in_stack_00000008 = (long)(pTVar1 + 1);
            Kernel::TermList::setContent(pTVar1,0);
          }
        }
        bVar2 = Kernel::MatchingUtils::matchReversedArgs
                          ((Literal *)in_stack_fffffffffffffe90,
                           (Literal *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88))
        ;
        in_stack_fffffffffffffeac = CONCAT13(bVar2,(int3)in_stack_fffffffffffffeac);
        if (bVar2) {
          ArrayStoringBinder::ArrayStoringBinder
                    (&local_d8,(TermList *)*in_stack_00000008,
                     &createLiteralBindings::variablePositions);
          Kernel::MatchingUtils::matchReversedArgs<(anonymous_namespace)::ArrayStoringBinder>
                    ((Literal *)
                     CONCAT17(in_stack_fffffffffffffebf,
                              CONCAT16(in_stack_fffffffffffffebe,
                                       CONCAT24(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
                                      )),in_stack_fffffffffffffeb0,
                     (ArrayStoringBinder *)
                     CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
          *(long *)*local_30 = *in_stack_00000008;
          *local_30 = *local_30 + 8;
          *in_stack_00000008 = *in_stack_00000008 + (ulong)local_a4 * 8;
          if (local_20 == (Literal *)0x0) {
            pTVar1 = (TermList *)*in_stack_00000008;
            *in_stack_00000008 = (long)(pTVar1 + 1);
            in_stack_fffffffffffffea8 =
                 Kernel::Clause::getLiteralPosition
                           ((Clause *)
                            CONCAT17(in_stack_fffffffffffffecf,
                                     CONCAT16(uVar4,in_stack_fffffffffffffec8)),lit);
            Kernel::TermList::setContent(pTVar1,(ulong)in_stack_fffffffffffffea8);
          }
          else {
            pTVar1 = (TermList *)*in_stack_00000008;
            *in_stack_00000008 = (long)(pTVar1 + 1);
            Kernel::TermList::setContent(pTVar1,0);
          }
        }
      }
      else {
        if (local_a4 != 0) {
          ArrayStoringBinder::ArrayStoringBinder
                    ((ArrayStoringBinder *)&stack0xffffffffffffff18,(TermList *)*in_stack_00000008,
                     &createLiteralBindings::variablePositions);
          Kernel::MatchingUtils::matchArgs<(anonymous_namespace)::ArrayStoringBinder>
                    (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        }
        *(long *)*local_30 = *in_stack_00000008;
        *local_30 = *local_30 + 8;
        *in_stack_00000008 = *in_stack_00000008 + (ulong)local_a4 * 8;
        if (local_20 == (Literal *)0x0) {
          in_stack_fffffffffffffe90 = (Term *)*in_stack_00000008;
          *in_stack_00000008 = (long)&in_stack_fffffffffffffe90->_functor;
          uVar6 = Kernel::Clause::getLiteralPosition
                            ((Clause *)
                             CONCAT17(in_stack_fffffffffffffecf,
                                      CONCAT16(uVar4,in_stack_fffffffffffffec8)),lit);
          Kernel::TermList::setContent((TermList *)in_stack_fffffffffffffe90,(ulong)uVar6);
        }
        else {
          pTVar1 = (TermList *)*in_stack_00000008;
          *in_stack_00000008 = (long)(pTVar1 + 1);
          Kernel::TermList::setContent(pTVar1,0);
        }
      }
    }
  }
  if (local_20 != (Literal *)0x0) {
    uVar6 = Kernel::Literal::complementaryHeader
                      ((Literal *)
                       CONCAT44(in_stack_fffffffffffffe84,
                                CONCAT13(in_stack_fffffffffffffe83,
                                         CONCAT12(in_stack_fffffffffffffe82,
                                                  CONCAT11(in_stack_fffffffffffffe81,
                                                           in_stack_fffffffffffffe80)))));
    uVar7 = Kernel::Literal::header
                      ((Literal *)
                       CONCAT44(in_stack_fffffffffffffe84,
                                CONCAT13(in_stack_fffffffffffffe83,
                                         CONCAT12(in_stack_fffffffffffffe82,
                                                  CONCAT11(in_stack_fffffffffffffe81,
                                                           in_stack_fffffffffffffe80)))));
    if (uVar6 == uVar7) {
      in_stack_fffffffffffffe84 = Kernel::Term::arity(local_8);
      if ((in_stack_fffffffffffffe84 == 0) ||
         (in_stack_fffffffffffffe83 =
               Kernel::MatchingUtils::matchArgs
                         (in_stack_fffffffffffffe90,(Term *)CONCAT44(uVar6,uVar7)),
         (bool)in_stack_fffffffffffffe83)) {
        if (local_a4 != 0) {
          ArrayStoringBinder::ArrayStoringBinder
                    ((ArrayStoringBinder *)&stack0xffffffffffffff08,(TermList *)*in_stack_00000008,
                     &createLiteralBindings::variablePositions);
          Kernel::MatchingUtils::matchArgs<(anonymous_namespace)::ArrayStoringBinder>
                    (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        }
        *(long *)*local_30 = *in_stack_00000008;
        *local_30 = *local_30 + 8;
        *in_stack_00000008 = *in_stack_00000008 + (ulong)local_a4 * 8;
        pTVar1 = (TermList *)*in_stack_00000008;
        *in_stack_00000008 = (long)(pTVar1 + 1);
        Kernel::TermList::setContent(pTVar1,1);
      }
      in_stack_fffffffffffffe82 = Kernel::Literal::isEquality((Literal *)0x8a25c5);
      if (((bool)in_stack_fffffffffffffe82) &&
         (in_stack_fffffffffffffe81 =
               Kernel::MatchingUtils::matchReversedArgs
                         ((Literal *)in_stack_fffffffffffffe90,(Literal *)CONCAT44(uVar6,uVar7)),
         (bool)in_stack_fffffffffffffe81)) {
        ArrayStoringBinder::ArrayStoringBinder
                  (&local_108,(TermList *)*in_stack_00000008,
                   &createLiteralBindings::variablePositions);
        Kernel::MatchingUtils::matchReversedArgs<(anonymous_namespace)::ArrayStoringBinder>
                  ((Literal *)
                   CONCAT17(in_stack_fffffffffffffebf,
                            CONCAT16(in_stack_fffffffffffffebe,
                                     CONCAT24(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)))
                   ,in_stack_fffffffffffffeb0,
                   (ArrayStoringBinder *)
                   CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        *(long *)*local_30 = *in_stack_00000008;
        *local_30 = *local_30 + 8;
        *in_stack_00000008 = *in_stack_00000008 + (ulong)local_a4 * 8;
        pTVar1 = (TermList *)*in_stack_00000008;
        *in_stack_00000008 = (long)(pTVar1 + 1);
        Kernel::TermList::setContent(pTVar1,1);
      }
    }
  }
  Kernel::VariableIterator::~VariableIterator
            ((VariableIterator *)
             CONCAT44(in_stack_fffffffffffffe84,
                      CONCAT13(in_stack_fffffffffffffe83,
                               CONCAT12(in_stack_fffffffffffffe82,
                                        CONCAT11(in_stack_fffffffffffffe81,in_stack_fffffffffffffe80
                                                )))));
  return true;
}

Assistant:

bool createLiteralBindings(Literal* baseLit, LiteralList const* alts, Clause* instCl, Literal* resolvedLit,
    unsigned*& boundVarData, TermList**& altBindingPtrs, TermList*& altBindingData)
{
  static UUMap variablePositions;
  static BinaryHeap<unsigned,Int> varNums;
  variablePositions.reset();
  varNums.reset();

  VariableIterator bvit(baseLit);
  while(bvit.hasNext()) {
    unsigned var=bvit.next().var();
    varNums.insert(var);
  }

  unsigned nextPos=0;
  while(!varNums.isEmpty()) {
    unsigned var=varNums.pop();
    while(!varNums.isEmpty() && varNums.top()==var) {
      varNums.pop();
    }
    ALWAYS(variablePositions.insert(var, nextPos));
    *(boundVarData++) = var;
    nextPos++;
  }
  unsigned numVars=nextPos;

  LiteralList::Iterator ait(alts);
  while(ait.hasNext()) {
    //handle multiple matches in equality!
    Literal* alit=ait.next();
    if(alit==resolvedLit) {
      continue;
    }
    if(alit->isEquality()) {
      //we must try both possibilities
      if(MatchingUtils::matchArgs(baseLit,alit)) {
	ArrayStoringBinder binder(altBindingData, variablePositions);
	MatchingUtils::matchArgs(baseLit,alit,binder);
	*altBindingPtrs=altBindingData;
	altBindingPtrs++;
	altBindingData+=numVars;
	if(resolvedLit) {
	  (altBindingData++)->setContent(0);
	} else {
          // add index of the literal in instance clause at the end of the binding sequence
	  (altBindingData++)->setContent(instCl->getLiteralPosition(alit));
	}
      }
      if(MatchingUtils::matchReversedArgs(baseLit, alit)) {
	ArrayStoringBinder binder(altBindingData, variablePositions);
	MatchingUtils::matchReversedArgs(baseLit, alit, binder);
	*altBindingPtrs=altBindingData;
	altBindingPtrs++;
	altBindingData+=numVars;
	if(resolvedLit) {
	  (altBindingData++)->setContent(0);
	} else {
          // add index of the literal in instance clause at the end of the binding sequence
	  (altBindingData++)->setContent(instCl->getLiteralPosition(alit));
	}
      }

    } else {
      if(numVars) {
	ArrayStoringBinder binder(altBindingData, variablePositions);
	ALWAYS(MatchingUtils::matchArgs(baseLit,alit,binder));
      }

      *altBindingPtrs=altBindingData;
      altBindingPtrs++;
      altBindingData+=numVars;
      if(resolvedLit) {
        (altBindingData++)->setContent(0);
      } else {
        // add index of the literal in instance clause at the end of the binding sequence
        (altBindingData++)->setContent((uint64_t)instCl->getLiteralPosition(alit));
      }
    }
  }
  if(resolvedLit && resolvedLit->complementaryHeader()==baseLit->header()) {
    if(!baseLit->arity() || MatchingUtils::matchArgs(baseLit,resolvedLit)) {
      if(numVars) {
	ArrayStoringBinder binder(altBindingData, variablePositions);
	MatchingUtils::matchArgs(baseLit,resolvedLit,binder);
      }
      *altBindingPtrs=altBindingData;
      altBindingPtrs++;
      altBindingData+=numVars;
      (altBindingData++)->setContent(1);
    }
    if(baseLit->isEquality() && MatchingUtils::matchReversedArgs(baseLit, resolvedLit)) {
      ArrayStoringBinder binder(altBindingData, variablePositions);
      MatchingUtils::matchReversedArgs(baseLit, resolvedLit, binder);
      *altBindingPtrs=altBindingData;
      altBindingPtrs++;
      altBindingData+=numVars;
      (altBindingData++)->setContent(1);
    }

  }
  return true;
}